

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall amrex::MLCellLinOp::prepareForSolve(MLCellLinOp *this)

{
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar14;
  long lVar15;
  double dVar16;
  ulong uVar17;
  pointer piVar18;
  int i;
  long lVar19;
  long lVar20;
  long lVar21;
  int *piVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  int j;
  uint uVar32;
  undefined8 *puVar33;
  long *plVar34;
  uint uVar35;
  int *piVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  int *piVar41;
  double dVar42;
  ulong uVar43;
  int iVar44;
  int *piVar45;
  long lVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  undefined8 *puVar50;
  long *plVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar69;
  double dVar70;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int *piVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int ki;
  int ji;
  IntVect hi;
  IntVect low;
  MFIter mfi;
  MultiFab foo;
  long local_698;
  Array4<double> local_638;
  Array4<double> local_5f8;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  int *local_598;
  ulong local_590;
  ulong local_588;
  int local_580;
  int local_57c;
  double *local_578;
  double *local_570;
  double *local_568;
  long local_560;
  long local_558;
  Array4<const_int> local_550;
  long local_510;
  long local_508;
  double *local_500;
  undefined1 local_4f8 [16];
  Array4<const_int> local_4e0;
  ulong local_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  undefined8 uStack_480;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  double *local_438;
  ulong local_430;
  uint local_424;
  int local_420;
  int local_41c;
  Array4<const_double> local_418;
  double local_3d8 [4];
  ulong local_3b8;
  ulong local_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  long local_398;
  long local_390;
  ulong local_388;
  int local_380;
  int local_37c;
  undefined1 local_378 [16];
  FabArray<amrex::EBCellFlagFab> *local_360;
  ulong local_358;
  double local_350;
  double local_348;
  double local_340;
  ulong local_338;
  double *local_330;
  ulong local_328;
  int local_320;
  FabType local_31c;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long *local_2f8;
  long *local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  undefined1 local_2d4 [20];
  uint local_2c0;
  IndexType local_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  MLCellLinOp *local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  ulong local_250;
  long local_248;
  long local_240;
  double *local_238;
  ulong local_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  MFIter local_210;
  MultiFab local_1b0;
  int iVar13;
  int iVar27;
  
  local_4a0 = (ulong)(uint)(this->super_MLLinOp).maxorder;
  local_424 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    uVar43 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
    local_388 = (ulong)((int)local_4a0 - 1);
    piVar18 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    local_230 = (ulong)local_424;
    local_278 = 0;
    local_280 = this;
    local_250 = uVar43;
    do {
      if (0 < piVar18[local_278]) {
        local_268 = local_278 * 0x18;
        local_270 = local_278 * 3;
        lVar14 = 0;
        do {
          local_318 = *(long *)(*(long *)((long)&(((this->m_bcondloc).
                                                                                                      
                                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                                 ).
                                                 super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                         local_268) + lVar14 * 8);
          local_240 = lVar14 * 0x900 +
                      *(long *)((long)&(((this->m_maskvals).
                                         super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                       ).
                                       super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_268);
          lVar28 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                                    .
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start + local_268);
          lVar19 = lVar14 * 200;
          local_340 = *(double *)(lVar28 + 0x38 + lVar19);
          local_348 = *(double *)(lVar28 + 0x40 + lVar19);
          local_350 = *(double *)(lVar28 + 0x48 + lVar19);
          local_248 = *(long *)((long)&(((this->m_undrrelxr).
                                         super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                       ).
                                       super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_268);
          _local_488 = (undefined1  [16])0x0;
          local_498 = (undefined1  [16])0x0;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = local_478._8_8_;
          local_478 = auVar75 << 0x40;
          local_210.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )&PTR__FabFactory_0080b918;
          MultiFab::MultiFab(&local_1b0,
                             (BoxArray *)
                             (lVar14 * 0x68 +
                             *(long *)((long)&(((this->super_MLLinOp).m_grids.
                                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                .
                                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                              ).
                                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                              ._M_impl.super__Vector_impl_data._M_start + local_268)
                             ),(DistributionMapping *)
                               (lVar14 * 0x10 +
                               *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                                  super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                                ).
                                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                        local_268)),local_424,0,(MFInfo *)local_498,
                             (FabFactory<amrex::FArrayBox> *)&local_210);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_488);
          _Var1._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)&(&(((this->super_MLLinOp).m_factory.
                        super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      ).
                      super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)[local_270][lVar14]._M_t;
          local_310 = lVar14;
          if (((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                )_Var1._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl
               == (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                   )0x0) ||
             (lVar14 = __dynamic_cast(_Var1._M_t.
                                      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                                      .
                                      super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>
                                      ._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                                      &EBFArrayBoxFactory::typeinfo,0), lVar14 == 0)) {
            local_228 = (undefined1  [16])0x0;
            local_218 = 0;
            local_360 = (FabArray<amrex::EBCellFlagFab> *)0x0;
          }
          else {
            local_360 = EBDataCollection::getMultiEBCellFlagFab
                                  (*(EBDataCollection **)(lVar14 + 0xd8));
            EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar14 + 0xd8));
          }
          local_498._0_3_ = 0x10100;
          local_498._4_4_ = Gpu::Device::max_gpu_streams;
          local_498._8_8_ = 0;
          auVar76._12_4_ = 0;
          auVar76._0_12_ = stack0xfffffffffffffb7c;
          _local_488 = auVar76 << 0x20;
          MFIter::MFIter(&local_210,(FabArrayBase *)&local_1b0,(MFItInfo *)local_498);
          while (local_210.currentIndex < local_210.endIndex) {
            BATransformer::operator()
                      ((Box *)local_2d4,&((local_210.fabArray)->boxarray).m_bat,
                       (Box *)((long)((local_210.index_map)->super_vector<int,_std::allocator<int>_>
                                     ).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[local_210.currentIndex] * 0x1c
                              + *(long *)&((((local_210.fabArray)->boxarray).m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data));
            lVar14 = (long)local_210.currentIndex;
            if (local_210.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              lVar14 = (long)((local_210.local_index_map)->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar14];
            }
            local_2f8 = (long *)(*(long *)(local_318 + 0x200) + lVar14 * 0x18);
            local_2f0 = (long *)(lVar14 * 0x18 + *(long *)(local_318 + 0xf0));
            if (local_360 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
              local_31c = regular;
            }
            else {
              local_31c = EBCellFlagFab::getType
                                    ((local_360->m_fabs_v).
                                     super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar14],
                                     (Box *)local_2d4);
            }
            uVar30 = 0;
            do {
              if (uVar30 != uVar43) {
                local_498._8_4_ = local_2d4._8_4_;
                local_498._0_8_ = local_2d4._0_8_;
                local_550.jstride._0_4_ = local_2c0;
                local_550.p = (int *)local_2d4._12_8_;
                iVar8 = *(int *)(local_498 + uVar30 * 4);
                *(int *)(local_498 + uVar30 * 4) = iVar8 + -1;
                *(int *)((long)&local_550.p + uVar30 * 4) = iVar8 + -1;
                uVar2 = local_498._0_4_;
                lVar20 = (long)(int)local_498._0_4_;
                uVar4 = local_498._4_4_;
                lVar21 = (long)(int)local_498._4_4_;
                uVar6 = local_498._8_4_;
                piVar22 = (int *)(long)(int)local_498._8_4_;
                local_588 = (ulong)local_550.p & 0xffffffff;
                local_5a0 = (ulong)local_550.p >> 0x20;
                local_5b0 = (ulong)(uint)local_550.jstride;
                local_498._8_4_ = local_2d4._8_4_;
                local_498._0_8_ = local_2d4._0_8_;
                local_550.jstride._0_4_ = local_2c0;
                local_550.p = (int *)local_2d4._12_8_;
                local_4e0.p = (int *)(CONCAT44(local_2bc.itype >> 1,local_2bc.itype) & 0x100000001);
                local_4e0.jstride._0_4_ = local_2bc.itype >> 2 & 1;
                iVar8 = (~*(uint *)((long)&local_4e0.p + uVar30 * 4) & 1) +
                        *(int *)((long)&local_550.p + uVar30 * 4);
                *(int *)(local_498 + uVar30 * 4) = iVar8;
                *(int *)((long)&local_550.p + uVar30 * 4) = iVar8;
                lVar28 = local_240;
                uVar3 = local_498._0_4_;
                lVar19 = (long)(int)local_498._0_4_;
                uVar5 = local_498._4_4_;
                lVar15 = (long)(int)local_498._4_4_;
                uVar7 = local_498._8_4_;
                dVar16 = (double)(long)(int)local_498._8_4_;
                local_590 = (ulong)local_550.p & 0xffffffff;
                local_5a8 = (ulong)local_550.p >> 0x20;
                local_5b8 = (ulong)(uint)local_550.jstride;
                iVar8 = *(int *)(local_2d4 + uVar30 * 4);
                iVar10 = *(int *)(local_2d4 + uVar30 * 4 + 0xc);
                lVar14 = uVar30 * 0x180;
                local_328 = uVar30;
                FabArray<amrex::Mask>::array<amrex::Mask,_0>
                          (&local_550,(FabArray<amrex::Mask> *)(local_240 + lVar14),&local_210);
                FabArray<amrex::Mask>::array<amrex::Mask,_0>
                          (&local_4e0,(FabArray<amrex::Mask> *)(lVar28 + lVar14 + 0x480),&local_210)
                ;
                lVar28 = local_248 + local_310 * 0x970 + 8;
                FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_5f8,(FabArray<amrex::FArrayBox> *)(lVar14 + lVar28),&local_210);
                FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_638,
                           (FabArray<amrex::FArrayBox> *)(uVar30 * 0x180 + 0x480 + lVar28),
                           &local_210);
                uVar30 = local_328;
                uVar43 = local_250;
                if (0 < (int)local_424) {
                  iVar9 = uVar4 + 1;
                  uVar24 = (iVar10 - iVar8) + 2;
                  uVar29 = (ulong)uVar24;
                  if ((int)local_4a0 < (int)uVar24) {
                    uVar29 = local_4a0 & 0xffffffff;
                  }
                  local_57c = uVar5 + -1;
                  local_37c = (int)local_588 + 1;
                  local_380 = (int)local_590 + 1;
                  iVar47 = (int)local_5a0 + 1;
                  iVar48 = (int)local_5a8 + 1;
                  uVar24 = (int)local_590 - uVar3;
                  uVar23 = (int)local_588 - uVar2;
                  uVar32 = (int)local_5a8 - uVar5;
                  uVar35 = (int)local_5a0 - uVar4;
                  local_358 = (ulong)uVar23 + 2 & 0x1fffffffe;
                  auVar77._4_4_ = 0;
                  auVar77._0_4_ = uVar23;
                  auVar77._8_4_ = uVar23;
                  auVar77._12_4_ = 0;
                  local_338 = (ulong)uVar24 + 2 & 0x1fffffffe;
                  auVar56._4_4_ = 0;
                  auVar56._0_4_ = uVar24;
                  auVar56._8_4_ = uVar24;
                  auVar56._12_4_ = 0;
                  local_2e0 = (ulong)uVar35 + 2 & 0x1fffffffe;
                  auVar78._4_4_ = 0;
                  auVar78._0_4_ = uVar35;
                  auVar78._8_4_ = uVar35;
                  auVar78._12_4_ = 0;
                  local_2e8 = (ulong)uVar32 + 2 & 0x1fffffffe;
                  auVar79._4_4_ = 0;
                  auVar79._0_4_ = uVar32;
                  auVar79._8_4_ = uVar32;
                  auVar79._12_4_ = 0;
                  local_3b8 = (ulong)(uint)(local_37c - uVar2);
                  local_3b0 = (ulong)(uint)(local_380 - uVar3);
                  local_420 = iVar47 - uVar4;
                  local_41c = iVar48 - uVar5;
                  local_320 = uVar2 + 1;
                  iVar8 = uVar6 + 1;
                  local_580 = uVar7 + -1;
                  iVar10 = (int)local_5b0 + 1;
                  iVar11 = (int)local_5b8 + 1;
                  uVar24 = (uint)uVar29;
                  uVar49 = (ulong)(uVar24 - 1);
                  local_558 = lVar20 * 8;
                  local_508 = lVar20 * 4;
                  local_560 = lVar19 * 8;
                  local_510 = lVar19 * 4;
                  local_260 = (long)local_320;
                  local_390 = (long)local_320 * 8;
                  local_300 = lVar21 + 1;
                  local_258 = (long)(uVar3 + -1);
                  local_398 = (long)(uVar3 + -1) * 8;
                  local_308 = lVar15 + 1;
                  local_698 = 0;
                  uVar17 = 0;
                  local_298 = auVar77;
                  local_378 = auVar56;
                  local_2a8 = auVar78;
                  local_2b8 = auVar79;
                  auVar75 = _DAT_0074fb30;
                  auVar76 = _DAT_0074fb40;
                  do {
                    dVar68 = 1.0;
                    dVar69 = 1.0;
                    uVar53 = 0x3ff0000000000000;
                    local_430 = uVar17;
                    lVar28 = uVar17 * 0x18 + *local_2f0;
                    iVar44 = *(int *)(lVar28 + local_328 * 4);
                    lVar14 = uVar17 * 0x30 + *local_2f8;
                    iVar74 = *(int *)(lVar28 + 0xc + local_328 * 4);
                    uVar43 = *(ulong *)(lVar14 + local_328 * 8);
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = uVar43;
                    dVar42 = *(double *)(lVar14 + 0x18 + local_328 * 8);
                    iVar73 = (int)local_328;
                    if (local_31c == regular) {
                      uVar30 = (ulong)DAT_0074fb00;
                      iVar12 = (int)local_5b0;
                      iVar38 = (int)local_588;
                      iVar25 = (int)local_3b8;
                      iVar13 = (int)local_5b8;
                      iVar37 = (int)local_590;
                      if (iVar73 == 1) {
                        if (iVar44 == 0x65) {
                          local_498._8_8_ = 0x3fe0000000000000;
                          local_498._0_8_ = (double)(uVar43 ^ uVar30) * local_348;
                          uStack_480 = 0x4004000000000000;
                          local_488 = (undefined1  [8])0x3ff8000000000000;
                          local_418.kstride = 0;
                          local_418.nstride = 0;
                          local_418.p = (double *)0x0;
                          local_418.jstride = 0;
                          if (0 < (int)uVar24) {
                            uVar43 = 0;
                            do {
                              uVar30 = 0;
                              dVar71 = dVar69;
                              dVar70 = dVar68;
                              do {
                                if (uVar43 != uVar30) {
                                  dVar71 = dVar71 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                  dVar70 = dVar70 * (*(double *)(local_498 + uVar43 * 8) -
                                                    *(double *)(local_498 + uVar30 * 8));
                                }
                                uVar30 = uVar30 + 1;
                              } while (uVar29 != uVar30);
                              (&local_418.p)[uVar43] = (double *)(dVar71 / dVar70);
                              uVar43 = uVar43 + 1;
                            } while (uVar43 != uVar29);
                          }
                          if ((int)uVar6 <= iVar12) {
                            lVar14 = (long)local_5f8.p +
                                     local_5f8.nstride * local_698 +
                                     ((long)piVar22 - (long)local_5f8.begin.z) *
                                     local_5f8.kstride * 8 +
                                     (iVar9 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                     (long)local_5f8.begin.x * -8 + local_558;
                            lVar28 = (long)local_550.p +
                                     ((long)piVar22 - (long)local_550.begin.z) *
                                     local_550.kstride * 4 +
                                     (long)(uVar4 - local_550.begin.y) *
                                     CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                     (long)local_550.begin.x * -4 + local_508;
                            piVar41 = piVar22;
                            do {
                              if ((int)uVar2 <= iVar38) {
                                lVar46 = 0;
                                do {
                                  piVar36 = (int *)local_418.jstride;
                                  if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                    piVar36 = (int *)0x0;
                                  }
                                  *(int **)(lVar14 + lVar46 * 8) = piVar36;
                                  lVar46 = lVar46 + 1;
                                } while (iVar25 != (int)lVar46);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                              lVar14 = lVar14 + local_5f8.kstride * 8;
                              lVar28 = lVar28 + local_550.kstride * 4;
                            } while (iVar10 != (int)piVar41);
                          }
                        }
                        else if (iVar44 == 0x66) {
                          if ((int)uVar6 <= iVar12) {
                            lVar14 = (long)local_5f8.p +
                                     local_5f8.nstride * local_698 +
                                     ((long)piVar22 - (long)local_5f8.begin.z) *
                                     local_5f8.kstride * 8 +
                                     (iVar9 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                     (long)local_5f8.begin.x * -8 + local_558 + 8;
                            piVar41 = piVar22;
                            do {
                              if ((int)uVar2 <= iVar38) {
                                uVar43 = 0;
                                do {
                                  auVar60._8_4_ = (int)uVar43;
                                  auVar60._0_8_ = uVar43;
                                  auVar60._12_4_ = (int)(uVar43 >> 0x20);
                                  auVar54 = (auVar60 | auVar75) ^ auVar76;
                                  bVar31 = SUB164(auVar77 ^ auVar76,0) < auVar54._0_4_;
                                  iVar44 = SUB164(auVar77 ^ auVar76,4);
                                  iVar73 = auVar54._4_4_;
                                  if ((bool)(~(iVar44 < iVar73 || iVar73 == iVar44 && bVar31) & 1))
                                  {
                                    *(undefined8 *)(lVar14 + -8 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar44 >= iVar73 && (iVar73 != iVar44 || !bVar31)) {
                                    *(undefined8 *)(lVar14 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar43 = uVar43 + 2;
                                } while (local_358 != uVar43);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                              lVar14 = lVar14 + local_5f8.kstride * 8;
                            } while (iVar10 != (int)piVar41);
                          }
                        }
                        else if ((iVar44 == 0x67) && ((int)uVar6 <= iVar12)) {
                          lVar14 = (long)local_5f8.p +
                                   local_5f8.nstride * local_698 +
                                   ((long)piVar22 - (long)local_5f8.begin.z) * local_5f8.kstride * 8
                                   + (iVar9 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                   (long)local_5f8.begin.x * -8 + local_558;
                          lVar28 = (long)local_550.p +
                                   ((long)piVar22 - (long)local_550.begin.z) * local_550.kstride * 4
                                   + (long)(uVar4 - local_550.begin.y) *
                                     CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                   (long)local_550.begin.x * -4 + local_508;
                          piVar41 = piVar22;
                          do {
                            if ((int)uVar2 <= iVar38) {
                              lVar46 = 0;
                              do {
                                uVar52 = uVar53;
                                if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                  uVar52 = 0;
                                }
                                *(undefined8 *)(lVar14 + lVar46 * 8) = uVar52;
                                lVar46 = lVar46 + 1;
                              } while (iVar25 != (int)lVar46);
                            }
                            piVar41 = (int *)((long)piVar41 + 1);
                            lVar14 = lVar14 + local_5f8.kstride * 8;
                            lVar28 = lVar28 + local_550.kstride * 4;
                          } while (iVar10 != (int)piVar41);
                        }
                        iVar44 = (int)local_3b0;
                        if (iVar74 == 0x65) {
                          local_498._8_8_ = 0x3fe0000000000000;
                          local_498._0_8_ = -dVar42 * local_348;
                          uStack_480 = 0x4004000000000000;
                          local_488 = (undefined1  [8])0x3ff8000000000000;
                          local_418.kstride = 0;
                          local_418.nstride = 0;
                          local_418.p = (double *)0x0;
                          local_418.jstride = 0;
                          if (0 < (int)uVar24) {
                            uVar43 = 0;
                            do {
                              uVar30 = 0;
                              dVar42 = dVar69;
                              dVar71 = dVar68;
                              do {
                                if (uVar43 != uVar30) {
                                  dVar42 = dVar42 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                  dVar71 = dVar71 * (*(double *)(local_498 + uVar43 * 8) -
                                                    *(double *)(local_498 + uVar30 * 8));
                                }
                                uVar30 = uVar30 + 1;
                              } while (uVar29 != uVar30);
                              (&local_418.p)[uVar43] = (double *)(dVar42 / dVar71);
                              uVar43 = uVar43 + 1;
                            } while (uVar43 != uVar29);
                          }
                          if ((int)uVar7 <= iVar13) {
                            lVar14 = (long)local_638.p +
                                     local_638.nstride * local_698 +
                                     ((long)dVar16 - (long)local_638.begin.z) *
                                     local_638.kstride * 8 +
                                     (local_57c - local_638.begin.y) * local_638.jstride * 8 +
                                     (long)local_638.begin.x * -8 + local_560;
                            lVar28 = (long)local_4e0.p +
                                     ((long)dVar16 - (long)local_4e0.begin.z) *
                                     local_4e0.kstride * 4 +
                                     (long)(uVar5 - local_4e0.begin.y) *
                                     CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4 +
                                     (long)local_4e0.begin.x * -4 + local_510;
                            dVar42 = dVar16;
                            do {
                              if ((int)uVar3 <= iVar37) {
                                lVar46 = 0;
                                do {
                                  piVar41 = (int *)local_418.jstride;
                                  if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                    piVar41 = (int *)0x0;
                                  }
                                  *(int **)(lVar14 + lVar46 * 8) = piVar41;
                                  lVar46 = lVar46 + 1;
                                } while (iVar44 != (int)lVar46);
                              }
                              dVar42 = (double)((long)dVar42 + 1);
                              lVar14 = lVar14 + local_638.kstride * 8;
                              lVar28 = lVar28 + local_4e0.kstride * 4;
                            } while (iVar11 != SUB84(dVar42,0));
                          }
                        }
                        else if (iVar74 == 0x66) {
                          if ((int)uVar7 <= iVar13) {
                            lVar14 = (long)local_638.p +
                                     local_638.nstride * local_698 +
                                     ((long)dVar16 - (long)local_638.begin.z) *
                                     local_638.kstride * 8 +
                                     (local_57c - local_638.begin.y) * local_638.jstride * 8 +
                                     (long)local_638.begin.x * -8 + local_560 + 8;
                            dVar42 = dVar16;
                            do {
                              if ((int)uVar3 <= iVar37) {
                                uVar43 = 0;
                                do {
                                  auVar63._8_4_ = (int)uVar43;
                                  auVar63._0_8_ = uVar43;
                                  auVar63._12_4_ = (int)(uVar43 >> 0x20);
                                  auVar54 = (auVar63 | auVar75) ^ auVar76;
                                  bVar31 = SUB164(auVar56 ^ auVar76,0) < auVar54._0_4_;
                                  iVar44 = SUB164(auVar56 ^ auVar76,4);
                                  iVar74 = auVar54._4_4_;
                                  if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1))
                                  {
                                    *(undefined8 *)(lVar14 + -8 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                    *(undefined8 *)(lVar14 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar43 = uVar43 + 2;
                                } while (local_338 != uVar43);
                              }
                              dVar42 = (double)((long)dVar42 + 1);
                              lVar14 = lVar14 + local_638.kstride * 8;
                            } while (iVar11 != SUB84(dVar42,0));
                          }
                        }
                        else if ((iVar74 == 0x67) && ((int)uVar7 <= iVar13)) {
                          lVar14 = (long)local_638.p +
                                   local_638.nstride * local_698 +
                                   ((long)dVar16 - (long)local_638.begin.z) * local_638.kstride * 8
                                   + (local_57c - local_638.begin.y) * local_638.jstride * 8 +
                                   (long)local_638.begin.x * -8 + local_560;
                          lVar28 = (long)local_4e0.p +
                                   ((long)dVar16 - (long)local_4e0.begin.z) * local_4e0.kstride * 4
                                   + (long)(uVar5 - local_4e0.begin.y) *
                                     CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4 +
                                   (long)local_4e0.begin.x * -4 + local_510;
                          dVar42 = dVar16;
                          do {
                            if ((int)uVar3 <= iVar37) {
                              lVar46 = 0;
                              do {
                                uVar53 = 0x3ff0000000000000;
                                if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                  uVar53 = 0;
                                }
                                *(undefined8 *)(lVar14 + lVar46 * 8) = uVar53;
                                lVar46 = lVar46 + 1;
                              } while (iVar44 != (int)lVar46);
                            }
                            dVar42 = (double)((long)dVar42 + 1);
                            lVar14 = lVar14 + local_638.kstride * 8;
                            lVar28 = lVar28 + local_4e0.kstride * 4;
                          } while (iVar11 != SUB84(dVar42,0));
                        }
                      }
                      else {
                        iVar26 = (int)local_5a0;
                        iVar27 = (int)local_5a8;
                        if (iVar73 == 0) {
                          if (iVar44 == 0x65) {
                            local_498._8_8_ = 0x3fe0000000000000;
                            local_498._0_8_ = (double)(uVar43 ^ uVar30) * local_340;
                            uStack_480 = 0x4004000000000000;
                            local_488 = (undefined1  [8])0x3ff8000000000000;
                            local_418.kstride = 0;
                            local_418.nstride = 0;
                            local_418.p = (double *)0x0;
                            local_418.jstride = 0;
                            if (0 < (int)uVar24) {
                              uVar43 = 0;
                              do {
                                uVar30 = 0;
                                dVar71 = dVar69;
                                dVar70 = dVar68;
                                do {
                                  if (uVar43 != uVar30) {
                                    dVar71 = dVar71 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                    dVar70 = dVar70 * (*(double *)(local_498 + uVar43 * 8) -
                                                      *(double *)(local_498 + uVar30 * 8));
                                  }
                                  uVar30 = uVar30 + 1;
                                } while (uVar29 != uVar30);
                                (&local_418.p)[uVar43] = (double *)(dVar71 / dVar70);
                                uVar43 = uVar43 + 1;
                              } while (uVar43 != uVar29);
                            }
                            if ((int)uVar6 <= iVar12) {
                              plVar34 = (long *)((long)local_5f8.p +
                                                local_5f8.nstride * local_698 +
                                                ((long)piVar22 - (long)local_5f8.begin.z) *
                                                local_5f8.kstride * 8 +
                                                (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8
                                                + (long)local_5f8.begin.x * -8 + local_390);
                              piVar36 = (int *)((long)local_550.p +
                                               ((long)piVar22 - (long)local_550.begin.z) *
                                               local_550.kstride * 4 +
                                               (lVar21 - local_550.begin.y) *
                                               CONCAT44(local_550.jstride._4_4_,
                                                        (uint)local_550.jstride) * 4 +
                                               (long)local_550.begin.x * -4 + local_508);
                              piVar41 = piVar22;
                              do {
                                piVar45 = piVar36;
                                plVar51 = plVar34;
                                iVar44 = local_420;
                                if ((int)uVar4 <= iVar26) {
                                  do {
                                    piVar72 = (int *)local_418.jstride;
                                    if (*piVar45 < 1) {
                                      piVar72 = (int *)0x0;
                                    }
                                    *plVar51 = (long)piVar72;
                                    plVar51 = plVar51 + local_5f8.jstride;
                                    piVar45 = piVar45 + CONCAT44(local_550.jstride._4_4_,
                                                                 (uint)local_550.jstride);
                                    iVar44 = iVar44 + -1;
                                  } while (iVar44 != 0);
                                }
                                piVar41 = (int *)((long)piVar41 + 1);
                                plVar34 = plVar34 + local_5f8.kstride;
                                piVar36 = piVar36 + local_550.kstride;
                              } while (iVar10 != (int)piVar41);
                            }
                          }
                          else if (iVar44 == 0x66) {
                            if ((int)uVar6 <= iVar12) {
                              lVar14 = local_5f8.kstride * 8;
                              lVar46 = ((long)piVar22 - (long)local_5f8.begin.z) * lVar14;
                              lVar28 = (long)local_5f8.p +
                                       (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 + lVar46
                                       + local_5f8.nstride * local_698 +
                                       (long)local_5f8.begin.x * -8 + local_390;
                              lVar46 = (long)local_5f8.p +
                                       (local_300 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                       lVar46 + local_5f8.nstride * local_698 +
                                       (long)local_5f8.begin.x * -8 + local_390;
                              piVar41 = piVar22;
                              do {
                                if ((int)uVar4 <= iVar26) {
                                  lVar40 = 0;
                                  uVar43 = 0;
                                  do {
                                    auVar57._8_4_ = (int)uVar43;
                                    auVar57._0_8_ = uVar43;
                                    auVar57._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar54 = (auVar57 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(auVar78 ^ auVar76,0) < auVar54._0_4_;
                                    iVar44 = SUB164(auVar78 ^ auVar76,4);
                                    iVar73 = auVar54._4_4_;
                                    if ((bool)(~(iVar44 < iVar73 || iVar73 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + lVar40) = 0x3ff0000000000000;
                                    }
                                    if (iVar44 >= iVar73 && (iVar73 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar46 + lVar40) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                    lVar40 = lVar40 + local_5f8.jstride * 0x10;
                                  } while (local_2e0 != uVar43);
                                }
                                piVar41 = (int *)((long)piVar41 + 1);
                                lVar28 = lVar28 + lVar14;
                                lVar46 = lVar46 + lVar14;
                              } while (iVar10 != (int)piVar41);
                            }
                          }
                          else if ((iVar44 == 0x67) && ((int)uVar6 <= iVar12)) {
                            puVar33 = (undefined8 *)
                                      ((long)local_5f8.p +
                                      local_5f8.nstride * local_698 +
                                      ((long)piVar22 - (long)local_5f8.begin.z) *
                                      local_5f8.kstride * 8 +
                                      (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                      (long)local_5f8.begin.x * -8 + local_390);
                            piVar36 = (int *)((long)local_550.p +
                                             ((long)piVar22 - (long)local_550.begin.z) *
                                             local_550.kstride * 4 +
                                             (lVar21 - local_550.begin.y) *
                                             CONCAT44(local_550.jstride._4_4_,
                                                      (uint)local_550.jstride) * 4 +
                                             (long)local_550.begin.x * -4 + local_508);
                            piVar41 = piVar22;
                            do {
                              piVar45 = piVar36;
                              puVar50 = puVar33;
                              iVar44 = local_420;
                              if ((int)uVar4 <= iVar26) {
                                do {
                                  uVar52 = uVar53;
                                  if (*piVar45 < 1) {
                                    uVar52 = 0;
                                  }
                                  *puVar50 = uVar52;
                                  puVar50 = puVar50 + local_5f8.jstride;
                                  piVar45 = piVar45 + CONCAT44(local_550.jstride._4_4_,
                                                               (uint)local_550.jstride);
                                  iVar44 = iVar44 + -1;
                                } while (iVar44 != 0);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                              puVar33 = puVar33 + local_5f8.kstride;
                              piVar36 = piVar36 + local_550.kstride;
                            } while (iVar10 != (int)piVar41);
                          }
                          if (iVar74 == 0x65) {
                            local_498._8_8_ = 0x3fe0000000000000;
                            local_498._0_8_ = -dVar42 * local_340;
                            uStack_480 = 0x4004000000000000;
                            local_488 = (undefined1  [8])0x3ff8000000000000;
                            local_418.kstride = 0;
                            local_418.nstride = 0;
                            local_418.p = (double *)0x0;
                            local_418.jstride = 0;
                            if (0 < (int)uVar24) {
                              uVar43 = 0;
                              do {
                                uVar30 = 0;
                                dVar42 = dVar69;
                                dVar71 = dVar68;
                                do {
                                  if (uVar43 != uVar30) {
                                    dVar42 = dVar42 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                    dVar71 = dVar71 * (*(double *)(local_498 + uVar43 * 8) -
                                                      *(double *)(local_498 + uVar30 * 8));
                                  }
                                  uVar30 = uVar30 + 1;
                                } while (uVar29 != uVar30);
                                (&local_418.p)[uVar43] = (double *)(dVar42 / dVar71);
                                uVar43 = uVar43 + 1;
                              } while (uVar43 != uVar29);
                            }
                            if ((int)uVar7 <= iVar13) {
                              plVar34 = (long *)((long)local_638.p +
                                                local_638.nstride * local_698 +
                                                ((long)dVar16 - (long)local_638.begin.z) *
                                                local_638.kstride * 8 +
                                                (lVar15 - local_638.begin.y) * local_638.jstride * 8
                                                + (long)local_638.begin.x * -8 + local_398);
                              piVar41 = (int *)((long)local_4e0.p +
                                               ((long)dVar16 - (long)local_4e0.begin.z) *
                                               local_4e0.kstride * 4 +
                                               (lVar15 - local_4e0.begin.y) *
                                               CONCAT44(local_4e0.jstride._4_4_,
                                                        (uint)local_4e0.jstride) * 4 +
                                               (long)local_4e0.begin.x * -4 + local_510);
                              dVar42 = dVar16;
                              do {
                                piVar36 = piVar41;
                                plVar51 = plVar34;
                                iVar44 = local_41c;
                                if ((int)uVar5 <= iVar27) {
                                  do {
                                    piVar45 = (int *)local_418.jstride;
                                    if (*piVar36 < 1) {
                                      piVar45 = (int *)0x0;
                                    }
                                    *plVar51 = (long)piVar45;
                                    plVar51 = plVar51 + local_638.jstride;
                                    piVar36 = piVar36 + CONCAT44(local_4e0.jstride._4_4_,
                                                                 (uint)local_4e0.jstride);
                                    iVar44 = iVar44 + -1;
                                  } while (iVar44 != 0);
                                }
                                dVar42 = (double)((long)dVar42 + 1);
                                plVar34 = plVar34 + local_638.kstride;
                                piVar41 = piVar41 + local_4e0.kstride;
                              } while (iVar11 != SUB84(dVar42,0));
                            }
                          }
                          else if (iVar74 == 0x66) {
                            if ((int)uVar7 <= iVar13) {
                              lVar14 = local_638.kstride * 8;
                              lVar46 = ((long)dVar16 - (long)local_638.begin.z) * lVar14;
                              lVar28 = (long)local_638.p +
                                       (lVar15 - local_638.begin.y) * local_638.jstride * 8 + lVar46
                                       + local_638.nstride * local_698 +
                                       (long)local_638.begin.x * -8 + local_398;
                              lVar46 = (long)local_638.p +
                                       (local_308 - local_638.begin.y) * local_638.jstride * 8 +
                                       lVar46 + local_638.nstride * local_698 +
                                       (long)local_638.begin.x * -8 + local_398;
                              dVar42 = dVar16;
                              do {
                                if ((int)uVar5 <= iVar27) {
                                  lVar40 = 0;
                                  uVar43 = 0;
                                  do {
                                    auVar61._8_4_ = (int)uVar43;
                                    auVar61._0_8_ = uVar43;
                                    auVar61._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar54 = (auVar61 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(auVar79 ^ auVar76,0) < auVar54._0_4_;
                                    iVar44 = SUB164(auVar79 ^ auVar76,4);
                                    iVar74 = auVar54._4_4_;
                                    if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + lVar40) = 0x3ff0000000000000;
                                    }
                                    if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar46 + lVar40) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                    lVar40 = lVar40 + local_638.jstride * 0x10;
                                  } while (local_2e8 != uVar43);
                                }
                                dVar42 = (double)((long)dVar42 + 1);
                                lVar28 = lVar28 + lVar14;
                                lVar46 = lVar46 + lVar14;
                              } while (iVar11 != SUB84(dVar42,0));
                            }
                          }
                          else if ((iVar74 == 0x67) && ((int)uVar7 <= iVar13)) {
                            puVar33 = (undefined8 *)
                                      ((long)local_638.p +
                                      local_638.nstride * local_698 +
                                      ((long)dVar16 - (long)local_638.begin.z) *
                                      local_638.kstride * 8 +
                                      (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                      (long)local_638.begin.x * -8 + local_398);
                            piVar41 = (int *)((long)local_4e0.p +
                                             ((long)dVar16 - (long)local_4e0.begin.z) *
                                             local_4e0.kstride * 4 +
                                             (lVar15 - local_4e0.begin.y) *
                                             CONCAT44(local_4e0.jstride._4_4_,
                                                      (uint)local_4e0.jstride) * 4 +
                                             (long)local_4e0.begin.x * -4 + local_510);
                            dVar42 = dVar16;
                            do {
                              piVar36 = piVar41;
                              puVar50 = puVar33;
                              iVar44 = local_41c;
                              if ((int)uVar5 <= iVar27) {
                                do {
                                  uVar53 = 0x3ff0000000000000;
                                  if (*piVar36 < 1) {
                                    uVar53 = 0;
                                  }
                                  *puVar50 = uVar53;
                                  puVar50 = puVar50 + local_638.jstride;
                                  piVar36 = piVar36 + CONCAT44(local_4e0.jstride._4_4_,
                                                               (uint)local_4e0.jstride);
                                  iVar44 = iVar44 + -1;
                                } while (iVar44 != 0);
                              }
                              dVar42 = (double)((long)dVar42 + 1);
                              puVar33 = puVar33 + local_638.kstride;
                              piVar41 = piVar41 + local_4e0.kstride;
                            } while (iVar11 != SUB84(dVar42,0));
                          }
                        }
                        else {
                          if (iVar44 == 0x65) {
                            local_498._8_8_ = 0x3fe0000000000000;
                            local_498._0_8_ = (double)(uVar43 ^ uVar30) * local_350;
                            uStack_480 = 0x4004000000000000;
                            local_488 = (undefined1  [8])0x3ff8000000000000;
                            local_418.kstride = 0;
                            local_418.nstride = 0;
                            local_418.p = (double *)0x0;
                            local_418.jstride = 0;
                            if (0 < (int)uVar24) {
                              uVar43 = 0;
                              do {
                                uVar30 = 0;
                                dVar71 = dVar69;
                                dVar70 = dVar68;
                                do {
                                  if (uVar43 != uVar30) {
                                    dVar71 = dVar71 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                    dVar70 = dVar70 * (*(double *)(local_498 + uVar43 * 8) -
                                                      *(double *)(local_498 + uVar30 * 8));
                                  }
                                  uVar30 = uVar30 + 1;
                                } while (uVar29 != uVar30);
                                (&local_418.p)[uVar43] = (double *)(dVar71 / dVar70);
                                uVar43 = uVar43 + 1;
                              } while (uVar43 != uVar29);
                            }
                            if ((int)uVar4 <= iVar26) {
                              lVar28 = (long)local_5f8.p +
                                       local_5f8.nstride * local_698 +
                                       (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                       (iVar8 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                       (long)local_5f8.begin.x * -8 + local_558;
                              lVar46 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4
                              ;
                              lVar40 = (long)local_550.p +
                                       (lVar21 - local_550.begin.y) * lVar46 +
                                       (uVar6 - local_550.begin.z) * local_550.kstride * 4 +
                                       (long)local_550.begin.x * -4 + local_508;
                              lVar14 = lVar21;
                              do {
                                if ((int)uVar2 <= iVar38) {
                                  lVar39 = 0;
                                  do {
                                    piVar41 = (int *)local_418.jstride;
                                    if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                      piVar41 = (int *)0x0;
                                    }
                                    *(int **)(lVar28 + lVar39 * 8) = piVar41;
                                    lVar39 = lVar39 + 1;
                                  } while (iVar25 != (int)lVar39);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_5f8.jstride * 8;
                                lVar40 = lVar40 + lVar46;
                              } while (iVar47 != (int)lVar14);
                            }
                          }
                          else if (iVar44 == 0x66) {
                            if ((int)uVar4 <= iVar26) {
                              lVar28 = (long)local_5f8.p +
                                       local_5f8.nstride * local_698 +
                                       (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                       (iVar8 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                       (long)local_5f8.begin.x * -8 + local_558 + 8;
                              lVar14 = lVar21;
                              do {
                                if ((int)uVar2 <= iVar38) {
                                  uVar43 = 0;
                                  do {
                                    auVar65._8_4_ = (int)uVar43;
                                    auVar65._0_8_ = uVar43;
                                    auVar65._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar54 = (auVar65 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(auVar77 ^ auVar76,0) < auVar54._0_4_;
                                    iVar44 = SUB164(auVar77 ^ auVar76,4);
                                    iVar73 = auVar54._4_4_;
                                    if ((bool)(~(iVar44 < iVar73 || iVar73 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + -8 + uVar43 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar44 >= iVar73 && (iVar73 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar28 + uVar43 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                  } while (local_358 != uVar43);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_5f8.jstride * 8;
                              } while (iVar47 != (int)lVar14);
                            }
                          }
                          else if ((iVar44 == 0x67) && ((int)uVar4 <= iVar26)) {
                            lVar28 = (long)local_5f8.p +
                                     local_5f8.nstride * local_698 +
                                     (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                     (iVar8 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                     (long)local_5f8.begin.x * -8 + local_558;
                            lVar46 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4;
                            lVar40 = (long)local_550.p +
                                     (lVar21 - local_550.begin.y) * lVar46 +
                                     (uVar6 - local_550.begin.z) * local_550.kstride * 4 +
                                     (long)local_550.begin.x * -4 + local_508;
                            lVar14 = lVar21;
                            do {
                              if ((int)uVar2 <= iVar38) {
                                lVar39 = 0;
                                do {
                                  uVar52 = uVar53;
                                  if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                    uVar52 = 0;
                                  }
                                  *(undefined8 *)(lVar28 + lVar39 * 8) = uVar52;
                                  lVar39 = lVar39 + 1;
                                } while (iVar25 != (int)lVar39);
                              }
                              lVar14 = lVar14 + 1;
                              lVar28 = lVar28 + local_5f8.jstride * 8;
                              lVar40 = lVar40 + lVar46;
                            } while (iVar47 != (int)lVar14);
                          }
                          iVar44 = (int)local_3b0;
                          if (iVar74 == 0x65) {
                            local_498._8_8_ = 0x3fe0000000000000;
                            local_498._0_8_ = -dVar42 * local_350;
                            uStack_480 = 0x4004000000000000;
                            local_488 = (undefined1  [8])0x3ff8000000000000;
                            local_418.kstride = 0;
                            local_418.nstride = 0;
                            local_418.p = (double *)0x0;
                            local_418.jstride = 0;
                            if (0 < (int)uVar24) {
                              uVar43 = 0;
                              do {
                                uVar30 = 0;
                                dVar42 = dVar69;
                                dVar71 = dVar68;
                                do {
                                  if (uVar43 != uVar30) {
                                    dVar42 = dVar42 * (-0.5 - *(double *)(local_498 + uVar30 * 8));
                                    dVar71 = dVar71 * (*(double *)(local_498 + uVar43 * 8) -
                                                      *(double *)(local_498 + uVar30 * 8));
                                  }
                                  uVar30 = uVar30 + 1;
                                } while (uVar29 != uVar30);
                                (&local_418.p)[uVar43] = (double *)(dVar42 / dVar71);
                                uVar43 = uVar43 + 1;
                              } while (uVar43 != uVar29);
                            }
                            if ((int)uVar5 <= iVar27) {
                              lVar28 = (long)local_638.p +
                                       local_638.nstride * local_698 +
                                       (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                       (local_580 - local_638.begin.z) * local_638.kstride * 8 +
                                       (long)local_638.begin.x * -8 + local_560;
                              lVar46 = CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4
                              ;
                              lVar40 = (long)local_4e0.p +
                                       (lVar15 - local_4e0.begin.y) * lVar46 +
                                       (uVar7 - local_4e0.begin.z) * local_4e0.kstride * 4 +
                                       (long)local_4e0.begin.x * -4 + local_510;
                              lVar14 = lVar15;
                              do {
                                if ((int)uVar3 <= iVar37) {
                                  lVar39 = 0;
                                  do {
                                    piVar41 = (int *)local_418.jstride;
                                    if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                      piVar41 = (int *)0x0;
                                    }
                                    *(int **)(lVar28 + lVar39 * 8) = piVar41;
                                    lVar39 = lVar39 + 1;
                                  } while (iVar44 != (int)lVar39);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_638.jstride * 8;
                                lVar40 = lVar40 + lVar46;
                              } while (iVar48 != (int)lVar14);
                            }
                          }
                          else if (iVar74 == 0x66) {
                            if ((int)uVar5 <= iVar27) {
                              lVar28 = (long)local_638.p +
                                       local_638.nstride * local_698 +
                                       (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                       (local_580 - local_638.begin.z) * local_638.kstride * 8 +
                                       (long)local_638.begin.x * -8 + local_560 + 8;
                              lVar14 = lVar15;
                              do {
                                if ((int)uVar3 <= iVar37) {
                                  uVar43 = 0;
                                  do {
                                    auVar67._8_4_ = (int)uVar43;
                                    auVar67._0_8_ = uVar43;
                                    auVar67._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar54 = (auVar67 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(auVar56 ^ auVar76,0) < auVar54._0_4_;
                                    iVar44 = SUB164(auVar56 ^ auVar76,4);
                                    iVar74 = auVar54._4_4_;
                                    if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + -8 + uVar43 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar28 + uVar43 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                  } while (local_338 != uVar43);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_638.jstride * 8;
                              } while (iVar48 != (int)lVar14);
                            }
                          }
                          else if ((iVar74 == 0x67) && ((int)uVar5 <= iVar27)) {
                            lVar28 = (long)local_638.p +
                                     local_638.nstride * local_698 +
                                     (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                     (local_580 - local_638.begin.z) * local_638.kstride * 8 +
                                     (long)local_638.begin.x * -8 + local_560;
                            lVar46 = CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4;
                            lVar40 = (long)local_4e0.p +
                                     (lVar15 - local_4e0.begin.y) * lVar46 +
                                     (uVar7 - local_4e0.begin.z) * local_4e0.kstride * 4 +
                                     (long)local_4e0.begin.x * -4 + local_510;
                            lVar14 = lVar15;
                            do {
                              if ((int)uVar3 <= iVar37) {
                                lVar39 = 0;
                                do {
                                  uVar53 = 0x3ff0000000000000;
                                  if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                    uVar53 = 0;
                                  }
                                  *(undefined8 *)(lVar28 + lVar39 * 8) = uVar53;
                                  lVar39 = lVar39 + 1;
                                } while (iVar44 != (int)lVar39);
                              }
                              lVar14 = lVar14 + 1;
                              lVar28 = lVar28 + local_638.jstride * 8;
                              lVar40 = lVar40 + lVar46;
                            } while (iVar48 != (int)lVar14);
                          }
                        }
                      }
                    }
                    else if (local_31c == singlevalued) {
                      local_4f8 = auVar54;
                      local_500 = (double *)CONCAT44(local_500._4_4_,iVar74);
                      local_3a8 = dVar42;
                      uStack_3a0 = 0;
                      MultiCutFab::const_array
                                (&local_418,*(MultiCutFab **)(local_228 + local_328 * 8),&local_210)
                      ;
                      auVar77 = local_298;
                      auVar78 = local_2a8;
                      auVar79 = local_2b8;
                      uVar43 = local_388;
                      dVar69 = local_3a8;
                      auVar76 = _DAT_0074fb40;
                      auVar75 = _DAT_0074fb30;
                      iVar74 = (int)local_5b0;
                      iVar37 = (int)local_588;
                      iVar12 = (int)local_5b8;
                      dVar42 = local_4f8._0_8_;
                      iVar13 = (int)local_590;
                      if (iVar73 == 1) {
                        if (iVar44 == 0x65) {
                          local_3d8[0] = (double)((ulong)dVar42 ^ (ulong)DAT_0074fb00) * local_348;
                          local_3d8[1] = 0.5;
                          local_3d8[2] = 1.5;
                          local_3d8[3] = 2.5;
                          local_448 = ZEXT816(0);
                          local_458 = ZEXT816(0);
                          local_468 = ZEXT816(0);
                          local_478 = ZEXT816(0);
                          _local_488 = ZEXT816(0);
                          local_498 = ZEXT816(0);
                          if (1 < (int)local_4a0) {
                            lVar14 = 2;
                            uVar30 = 0;
                            do {
                              lVar28 = 0;
                              do {
                                lVar46 = 0;
                                dVar42 = 1.0;
                                dVar68 = 1.0;
                                do {
                                  if (lVar28 != lVar46) {
                                    dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                    dVar68 = dVar68 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                  }
                                  lVar46 = lVar46 + 1;
                                } while (lVar14 != lVar46);
                                *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                     dVar42 / dVar68;
                                lVar28 = lVar28 + 1;
                              } while (lVar28 != lVar14);
                              uVar30 = uVar30 + 1;
                              lVar14 = lVar14 + 1;
                            } while (uVar30 != uVar43);
                          }
                          if ((int)uVar6 <= iVar74) {
                            local_598 = (int *)(long)local_550.begin.z;
                            local_4f8._0_8_ =
                                 local_550.p +
                                 (lVar21 - local_550.begin.y) *
                                 CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride);
                            local_568 = (double *)local_550.kstride;
                            local_570 = (double *)(long)local_5f8.begin.z;
                            local_578 = (double *)local_5f8.kstride;
                            local_438 = local_5f8.p +
                                        ((long)iVar9 - (long)local_5f8.begin.y) * local_5f8.jstride
                                        + local_5f8.nstride * local_430;
                            piVar41 = piVar22;
                            do {
                              if ((int)uVar2 <= iVar37) {
                                lVar14 = lVar20;
                                do {
                                  dVar42 = 0.0;
                                  if ((0 < (local_550.p +
                                           (lVar21 - local_550.begin.y) *
                                           CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride)
                                           )[((long)piVar41 - (long)local_598) * local_550.kstride +
                                             (lVar14 - local_550.begin.x)]) && (1 < (int)uVar24)) {
                                    uVar43 = 0;
                                    bVar31 = false;
                                    do {
                                      if (local_418.p
                                          [((long)piVar41 - (long)local_418.begin.z) *
                                           local_418.kstride +
                                           (lVar14 - local_418.begin.x) +
                                           ((iVar9 - local_418.begin.y) + (int)uVar43) *
                                           local_418.jstride] <= 0.0) {
                                        uVar23 = (int)uVar43 + 1;
                                        break;
                                      }
                                      bVar31 = (bool)(bVar31 | local_418.p
                                                               [((long)piVar41 -
                                                                (long)local_418.begin.z) *
                                                                local_418.kstride +
                                                                (lVar14 - local_418.begin.x) +
                                                                ((iVar9 - local_418.begin.y) +
                                                                (int)uVar43) * local_418.jstride] <
                                                               1.0);
                                      uVar43 = uVar43 + 1;
                                      uVar23 = uVar24;
                                    } while (uVar49 != uVar43);
                                    if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                       (uVar32 = uVar23, uVar23 != 1)) {
                                      dVar42 = *(double *)
                                                (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                    }
                                  }
                                  (local_5f8.p +
                                  ((long)iVar9 - (long)local_5f8.begin.y) * local_5f8.jstride +
                                  local_5f8.nstride * local_430)
                                  [((long)piVar41 - (long)local_570) * local_5f8.kstride +
                                   (lVar14 - local_5f8.begin.x)] = dVar42;
                                  lVar14 = lVar14 + 1;
                                } while (local_37c != (int)lVar14);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                            } while (iVar10 != (int)piVar41);
                          }
                        }
                        else if (iVar44 == 0x66) {
                          if ((int)uVar6 <= iVar74) {
                            lVar14 = (long)local_5f8.p +
                                     local_5f8.nstride * local_698 +
                                     ((long)piVar22 - (long)local_5f8.begin.z) *
                                     local_5f8.kstride * 8 +
                                     (iVar9 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                     (long)local_5f8.begin.x * -8 + local_558 + 8;
                            piVar41 = piVar22;
                            do {
                              if ((int)uVar2 <= iVar37) {
                                uVar43 = 0;
                                do {
                                  auVar58._8_4_ = (int)uVar43;
                                  auVar58._0_8_ = uVar43;
                                  auVar58._12_4_ = (int)(uVar43 >> 0x20);
                                  auVar56 = (auVar58 | auVar75) ^ auVar76;
                                  bVar31 = SUB164(local_298 ^ auVar76,0) < auVar56._0_4_;
                                  iVar44 = SUB164(local_298 ^ auVar76,4);
                                  iVar74 = auVar56._4_4_;
                                  if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1))
                                  {
                                    *(undefined8 *)(lVar14 + -8 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                    *(undefined8 *)(lVar14 + uVar43 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar43 = uVar43 + 2;
                                } while (local_358 != uVar43);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                              lVar14 = lVar14 + local_5f8.kstride * 8;
                            } while (iVar10 != (int)piVar41);
                          }
                        }
                        else if ((iVar44 == 0x67) && ((int)uVar6 <= iVar74)) {
                          lVar14 = (long)local_5f8.p +
                                   local_5f8.nstride * local_698 +
                                   ((long)piVar22 - (long)local_5f8.begin.z) * local_5f8.kstride * 8
                                   + (iVar9 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                   (long)local_5f8.begin.x * -8 + local_558;
                          lVar28 = (long)local_550.p +
                                   ((long)piVar22 - (long)local_550.begin.z) * local_550.kstride * 4
                                   + (long)(uVar4 - local_550.begin.y) *
                                     CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                   (long)local_550.begin.x * -4 + local_508;
                          piVar41 = piVar22;
                          do {
                            if ((int)uVar2 <= iVar37) {
                              lVar46 = 0;
                              do {
                                uVar53 = 0x3ff0000000000000;
                                if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                  uVar53 = 0;
                                }
                                *(undefined8 *)(lVar14 + lVar46 * 8) = uVar53;
                                lVar46 = lVar46 + 1;
                              } while ((int)local_3b8 != (int)lVar46);
                            }
                            piVar41 = (int *)((long)piVar41 + 1);
                            lVar14 = lVar14 + local_5f8.kstride * 8;
                            lVar28 = lVar28 + local_550.kstride * 4;
                          } while (iVar10 != (int)piVar41);
                        }
                        uVar43 = local_388;
                        if ((int)local_500 == 0x65) {
                          local_3d8[0] = -dVar69 * local_348;
                          local_3d8[1] = 0.5;
                          local_3d8[2] = 1.5;
                          local_3d8[3] = 2.5;
                          local_448 = ZEXT816(0);
                          local_458 = ZEXT816(0);
                          local_468 = ZEXT816(0);
                          local_478 = ZEXT816(0);
                          _local_488 = ZEXT816(0);
                          local_498 = ZEXT816(0);
                          if (1 < (int)local_4a0) {
                            lVar14 = 2;
                            uVar30 = 0;
                            do {
                              lVar28 = 0;
                              do {
                                lVar46 = 0;
                                dVar42 = 1.0;
                                dVar69 = 1.0;
                                do {
                                  if (lVar28 != lVar46) {
                                    dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                    dVar69 = dVar69 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                  }
                                  lVar46 = lVar46 + 1;
                                } while (lVar14 != lVar46);
                                *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                     dVar42 / dVar69;
                                lVar28 = lVar28 + 1;
                              } while (lVar28 != lVar14);
                              uVar30 = uVar30 + 1;
                              lVar14 = lVar14 + 1;
                            } while (uVar30 != uVar43);
                          }
                          auVar56 = local_378;
                          if ((int)uVar7 <= iVar12) {
                            local_3a8 = (double)(long)local_4e0.begin.z;
                            local_598 = local_4e0.p +
                                        (lVar15 - local_4e0.begin.y) *
                                        CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride);
                            local_500 = (double *)local_4e0.kstride;
                            local_568 = (double *)(long)local_638.begin.z;
                            local_570 = (double *)local_638.kstride;
                            local_578 = local_638.p +
                                        ((long)local_57c - (long)local_638.begin.y) *
                                        local_638.jstride + local_638.nstride * local_430;
                            local_4f8._0_8_ = dVar16;
                            do {
                              if ((int)uVar3 <= iVar13) {
                                lVar14 = lVar19;
                                do {
                                  dVar42 = 0.0;
                                  if ((0 < local_598[(local_4f8._0_8_ - (long)local_4e0.begin.z) *
                                                     local_4e0.kstride +
                                                     (lVar14 - local_4e0.begin.x)]) &&
                                     (1 < (int)uVar24)) {
                                    uVar43 = 0;
                                    bVar31 = false;
                                    iVar44 = uVar5 - local_418.begin.y;
                                    do {
                                      if (local_418.p
                                          [(local_4f8._0_8_ - (long)local_418.begin.z) *
                                           local_418.kstride +
                                           (lVar14 - local_418.begin.x) + iVar44 * local_418.jstride
                                          ] <= 0.0) {
                                        uVar23 = (int)uVar43 + 1;
                                        break;
                                      }
                                      bVar31 = (bool)(bVar31 | local_418.p
                                                               [(local_4f8._0_8_ -
                                                                (long)local_418.begin.z) *
                                                                local_418.kstride +
                                                                (lVar14 - local_418.begin.x) +
                                                                iVar44 * local_418.jstride] < 1.0);
                                      uVar43 = uVar43 + 1;
                                      iVar44 = iVar44 + -1;
                                      uVar23 = uVar24;
                                    } while (uVar49 != uVar43);
                                    if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                       (uVar32 = uVar23, uVar23 != 1)) {
                                      dVar42 = *(double *)
                                                (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                    }
                                  }
                                  local_578[(local_4f8._0_8_ - (long)local_568) * local_638.kstride
                                            + (lVar14 - local_638.begin.x)] = dVar42;
                                  lVar14 = lVar14 + 1;
                                } while (local_380 != (int)lVar14);
                              }
                              lVar14 = local_4f8._0_8_ + 1;
                              local_4f8._0_8_ = lVar14;
                            } while (iVar11 != (int)lVar14);
                          }
                        }
                        else {
                          auVar56 = local_378;
                          if ((int)local_500 == 0x66) {
                            if ((int)uVar7 <= iVar12) {
                              lVar14 = (long)local_638.p +
                                       local_638.nstride * local_698 +
                                       ((long)dVar16 - (long)local_638.begin.z) *
                                       local_638.kstride * 8 +
                                       (local_57c - local_638.begin.y) * local_638.jstride * 8 +
                                       (long)local_638.begin.x * -8 + local_560 + 8;
                              dVar42 = dVar16;
                              do {
                                if ((int)uVar3 <= iVar13) {
                                  uVar43 = 0;
                                  do {
                                    auVar62._8_4_ = (int)uVar43;
                                    auVar62._0_8_ = uVar43;
                                    auVar62._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar54 = (auVar62 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(local_378 ^ auVar76,0) < auVar54._0_4_;
                                    iVar44 = SUB164(local_378 ^ auVar76,4);
                                    iVar74 = auVar54._4_4_;
                                    if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar14 + -8 + uVar43 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar14 + uVar43 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                  } while (local_338 != uVar43);
                                }
                                dVar42 = (double)((long)dVar42 + 1);
                                lVar14 = lVar14 + local_638.kstride * 8;
                              } while (iVar11 != SUB84(dVar42,0));
                            }
                          }
                          else if (((int)local_500 == 0x67) && ((int)uVar7 <= iVar12)) {
                            lVar14 = (long)local_638.p +
                                     local_638.nstride * local_698 +
                                     ((long)dVar16 - (long)local_638.begin.z) *
                                     local_638.kstride * 8 +
                                     (local_57c - local_638.begin.y) * local_638.jstride * 8 +
                                     (long)local_638.begin.x * -8 + local_560;
                            lVar28 = (long)local_4e0.p +
                                     ((long)dVar16 - (long)local_4e0.begin.z) *
                                     local_4e0.kstride * 4 +
                                     (long)(uVar5 - local_4e0.begin.y) *
                                     CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4 +
                                     (long)local_4e0.begin.x * -4 + local_510;
                            dVar42 = dVar16;
                            do {
                              if ((int)uVar3 <= iVar13) {
                                lVar46 = 0;
                                do {
                                  uVar53 = 0x3ff0000000000000;
                                  if (*(int *)(lVar28 + lVar46 * 4) < 1) {
                                    uVar53 = 0;
                                  }
                                  *(undefined8 *)(lVar14 + lVar46 * 8) = uVar53;
                                  lVar46 = lVar46 + 1;
                                } while ((int)local_3b0 != (int)lVar46);
                              }
                              dVar42 = (double)((long)dVar42 + 1);
                              lVar14 = lVar14 + local_638.kstride * 8;
                              lVar28 = lVar28 + local_4e0.kstride * 4;
                            } while (iVar11 != SUB84(dVar42,0));
                          }
                        }
                      }
                      else {
                        iVar25 = (int)local_5a0;
                        iVar38 = (int)local_5a8;
                        if (iVar73 == 0) {
                          if (iVar44 == 0x65) {
                            local_3d8[0] = -dVar42 * local_340;
                            local_3d8[1] = 0.5;
                            local_3d8[2] = 1.5;
                            local_3d8[3] = 2.5;
                            local_448 = ZEXT816(0);
                            local_458 = local_448;
                            local_468 = local_448;
                            local_478 = local_448;
                            _local_488 = local_448;
                            local_498 = local_448;
                            if (1 < (int)local_4a0) {
                              lVar14 = 2;
                              uVar30 = 0;
                              do {
                                lVar28 = 0;
                                do {
                                  lVar46 = 0;
                                  dVar42 = 1.0;
                                  dVar68 = 1.0;
                                  do {
                                    if (lVar28 != lVar46) {
                                      dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                      dVar68 = dVar68 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                    }
                                    lVar46 = lVar46 + 1;
                                  } while (lVar14 != lVar46);
                                  *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                       dVar42 / dVar68;
                                  lVar28 = lVar28 + 1;
                                } while (lVar28 != lVar14);
                                uVar30 = uVar30 + 1;
                                lVar14 = lVar14 + 1;
                              } while (uVar30 != uVar43);
                            }
                            if ((int)uVar6 <= iVar74) {
                              local_570 = (double *)local_550.kstride;
                              local_578 = (double *)(long)local_550.begin.z;
                              local_568 = (double *)(local_550.p + (lVar20 - local_550.begin.x));
                              local_438 = (double *)local_5f8.kstride;
                              local_330 = (double *)(long)local_5f8.begin.z;
                              local_238 = local_5f8.p +
                                          (local_260 - local_5f8.begin.x) +
                                          local_5f8.nstride * local_430;
                              local_598 = piVar22;
                              do {
                                if ((int)uVar4 <= iVar25) {
                                  local_4f8._0_8_ = (long)local_418.begin.y;
                                  lVar14 = lVar21;
                                  do {
                                    dVar42 = 0.0;
                                    if ((0 < *(int *)((long)local_568 +
                                                     (lVar14 - local_550.begin.y) *
                                                     CONCAT44(local_550.jstride._4_4_,
                                                              (uint)local_550.jstride) * 4 +
                                                     ((long)local_598 - (long)local_578) *
                                                     local_550.kstride * 4)) && (1 < (int)uVar24)) {
                                      uVar43 = 0;
                                      bVar31 = false;
                                      do {
                                        if (local_418.p
                                            [((long)local_598 - (long)local_418.begin.z) *
                                             local_418.kstride +
                                             (lVar14 - local_418.begin.y) * local_418.jstride +
                                             (long)((local_320 - local_418.begin.x) + (int)uVar43)]
                                            <= 0.0) {
                                          uVar23 = (int)uVar43 + 1;
                                          break;
                                        }
                                        bVar31 = (bool)(bVar31 | local_418.p
                                                                 [((long)local_598 -
                                                                  (long)local_418.begin.z) *
                                                                  local_418.kstride +
                                                                  (lVar14 - local_418.begin.y) *
                                                                  local_418.jstride +
                                                                  (long)((local_320 -
                                                                         local_418.begin.x) +
                                                                        (int)uVar43)] < 1.0);
                                        uVar43 = uVar43 + 1;
                                        uVar23 = uVar24;
                                      } while (uVar49 != uVar43);
                                      if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                         (uVar32 = uVar23, uVar23 != 1)) {
                                        dVar42 = *(double *)
                                                  (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                      }
                                    }
                                    (local_5f8.p +
                                    (local_260 - local_5f8.begin.x) + local_5f8.nstride * local_430)
                                    [((long)local_598 - (long)local_5f8.begin.z) * local_5f8.kstride
                                     + (lVar14 - local_5f8.begin.y) * local_5f8.jstride] = dVar42;
                                    lVar14 = lVar14 + 1;
                                  } while (iVar47 != (int)lVar14);
                                }
                                local_598 = (int *)((long)local_598 + 1);
                              } while (iVar10 != (int)local_598);
                            }
                          }
                          else if (iVar44 == 0x66) {
                            if ((int)uVar6 <= iVar74) {
                              lVar14 = local_5f8.kstride * 8;
                              lVar46 = ((long)piVar22 - (long)local_5f8.begin.z) * lVar14;
                              lVar28 = (long)local_5f8.p +
                                       (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 + lVar46
                                       + local_5f8.nstride * local_698 +
                                       (long)local_5f8.begin.x * -8 + local_390;
                              lVar46 = (long)local_5f8.p +
                                       (local_300 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                       lVar46 + local_5f8.nstride * local_698 +
                                       (long)local_5f8.begin.x * -8 + local_390;
                              piVar41 = piVar22;
                              do {
                                if ((int)uVar4 <= iVar25) {
                                  lVar40 = 0;
                                  uVar43 = 0;
                                  do {
                                    auVar55._8_4_ = (int)uVar43;
                                    auVar55._0_8_ = uVar43;
                                    auVar55._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar56 = (auVar55 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(local_2a8 ^ auVar76,0) < auVar56._0_4_;
                                    iVar44 = SUB164(local_2a8 ^ auVar76,4);
                                    iVar74 = auVar56._4_4_;
                                    if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + lVar40) = 0x3ff0000000000000;
                                    }
                                    if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar46 + lVar40) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                    lVar40 = lVar40 + local_5f8.jstride * 0x10;
                                  } while (local_2e0 != uVar43);
                                }
                                piVar41 = (int *)((long)piVar41 + 1);
                                lVar28 = lVar28 + lVar14;
                                lVar46 = lVar46 + lVar14;
                              } while (iVar10 != (int)piVar41);
                            }
                          }
                          else if ((iVar44 == 0x67) && ((int)uVar6 <= iVar74)) {
                            puVar33 = (undefined8 *)
                                      ((long)local_5f8.p +
                                      local_5f8.nstride * local_698 +
                                      ((long)piVar22 - (long)local_5f8.begin.z) *
                                      local_5f8.kstride * 8 +
                                      (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                      (long)local_5f8.begin.x * -8 + local_390);
                            piVar36 = (int *)((long)local_550.p +
                                             ((long)piVar22 - (long)local_550.begin.z) *
                                             local_550.kstride * 4 +
                                             (lVar21 - local_550.begin.y) *
                                             CONCAT44(local_550.jstride._4_4_,
                                                      (uint)local_550.jstride) * 4 +
                                             (long)local_550.begin.x * -4 + local_508);
                            piVar41 = piVar22;
                            do {
                              piVar45 = piVar36;
                              puVar50 = puVar33;
                              iVar44 = local_420;
                              if ((int)uVar4 <= iVar25) {
                                do {
                                  uVar53 = 0x3ff0000000000000;
                                  if (*piVar45 < 1) {
                                    uVar53 = 0;
                                  }
                                  *puVar50 = uVar53;
                                  puVar50 = puVar50 + local_5f8.jstride;
                                  piVar45 = piVar45 + CONCAT44(local_550.jstride._4_4_,
                                                               (uint)local_550.jstride);
                                  iVar44 = iVar44 + -1;
                                } while (iVar44 != 0);
                              }
                              piVar41 = (int *)((long)piVar41 + 1);
                              puVar33 = puVar33 + local_5f8.kstride;
                              piVar36 = piVar36 + local_550.kstride;
                            } while (iVar10 != (int)piVar41);
                          }
                          uVar43 = local_388;
                          if ((int)local_500 == 0x65) {
                            local_3d8[0] = -dVar69 * local_340;
                            local_3d8[1] = 0.5;
                            local_3d8[2] = 1.5;
                            local_3d8[3] = 2.5;
                            local_448 = ZEXT816(0);
                            local_458 = ZEXT816(0);
                            local_468 = ZEXT816(0);
                            local_478 = ZEXT816(0);
                            _local_488 = ZEXT816(0);
                            local_498 = ZEXT816(0);
                            if (1 < (int)local_4a0) {
                              lVar14 = 2;
                              uVar30 = 0;
                              do {
                                lVar28 = 0;
                                do {
                                  lVar46 = 0;
                                  dVar42 = 1.0;
                                  dVar69 = 1.0;
                                  do {
                                    if (lVar28 != lVar46) {
                                      dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                      dVar69 = dVar69 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                    }
                                    lVar46 = lVar46 + 1;
                                  } while (lVar14 != lVar46);
                                  *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                       dVar42 / dVar69;
                                  lVar28 = lVar28 + 1;
                                } while (lVar28 != lVar14);
                                uVar30 = uVar30 + 1;
                                lVar14 = lVar14 + 1;
                              } while (uVar30 != uVar43);
                            }
                            auVar56 = local_378;
                            if ((int)uVar7 <= iVar12) {
                              local_568 = (double *)local_4e0.kstride;
                              local_570 = (double *)(long)local_4e0.begin.z;
                              local_500 = (double *)(local_4e0.p + (lVar19 - local_4e0.begin.x));
                              local_578 = (double *)local_638.kstride;
                              local_438 = (double *)(long)local_638.begin.z;
                              local_330 = local_638.p +
                                          (local_258 - local_638.begin.x) +
                                          local_638.nstride * local_430;
                              local_3a8 = dVar16;
                              do {
                                if ((int)uVar5 <= iVar38) {
                                  local_4f8._0_8_ = (long)local_418.begin.y;
                                  local_598 = (int *)local_418.jstride;
                                  lVar14 = lVar15;
                                  do {
                                    dVar42 = 0.0;
                                    if ((0 < *(int *)((long)(local_4e0.p +
                                                            (lVar19 - local_4e0.begin.x)) +
                                                     (lVar14 - local_4e0.begin.y) *
                                                     CONCAT44(local_4e0.jstride._4_4_,
                                                              (uint)local_4e0.jstride) * 4 +
                                                     ((long)local_3a8 - (long)local_570) *
                                                     local_4e0.kstride * 4)) && (1 < (int)uVar24)) {
                                      uVar43 = 0;
                                      bVar31 = false;
                                      iVar44 = uVar3 - local_418.begin.x;
                                      do {
                                        if (local_418.p
                                            [((long)local_3a8 - (long)local_418.begin.z) *
                                             local_418.kstride +
                                             (lVar14 - local_418.begin.y) * local_418.jstride +
                                             (long)iVar44] <= 0.0) {
                                          uVar30 = (ulong)((int)uVar43 + 1);
                                          break;
                                        }
                                        bVar31 = (bool)(bVar31 | local_418.p
                                                                 [((long)local_3a8 -
                                                                  (long)local_418.begin.z) *
                                                                  local_418.kstride +
                                                                  (lVar14 - local_418.begin.y) *
                                                                  local_418.jstride + (long)iVar44]
                                                                 < 1.0);
                                        uVar43 = uVar43 + 1;
                                        iVar44 = iVar44 + -1;
                                        uVar30 = uVar29;
                                      } while (uVar49 != uVar43);
                                      uVar23 = (uint)uVar30;
                                      if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                         (uVar32 = uVar23, uVar23 != 1)) {
                                        dVar42 = *(double *)
                                                  (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                      }
                                    }
                                    (local_638.p +
                                    (local_258 - local_638.begin.x) + local_638.nstride * local_430)
                                    [((long)local_3a8 - (long)local_638.begin.z) * local_638.kstride
                                     + (lVar14 - local_638.begin.y) * local_638.jstride] = dVar42;
                                    lVar14 = lVar14 + 1;
                                  } while (iVar48 != (int)lVar14);
                                }
                                local_3a8 = (double)((long)local_3a8 + 1);
                              } while (iVar11 != SUB84(local_3a8,0));
                            }
                          }
                          else {
                            auVar56 = local_378;
                            if ((int)local_500 == 0x66) {
                              if ((int)uVar7 <= iVar12) {
                                lVar14 = local_638.kstride * 8;
                                lVar46 = ((long)dVar16 - (long)local_638.begin.z) * lVar14;
                                lVar28 = (long)local_638.p +
                                         (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                         lVar46 + local_638.nstride * local_698 +
                                         (long)local_638.begin.x * -8 + local_398;
                                lVar46 = (long)local_638.p +
                                         (local_308 - local_638.begin.y) * local_638.jstride * 8 +
                                         lVar46 + local_638.nstride * local_698 +
                                         (long)local_638.begin.x * -8 + local_398;
                                dVar42 = dVar16;
                                do {
                                  if ((int)uVar5 <= iVar38) {
                                    lVar40 = 0;
                                    uVar43 = 0;
                                    do {
                                      auVar59._8_4_ = (int)uVar43;
                                      auVar59._0_8_ = uVar43;
                                      auVar59._12_4_ = (int)(uVar43 >> 0x20);
                                      auVar54 = (auVar59 | auVar75) ^ auVar76;
                                      bVar31 = SUB164(auVar79 ^ auVar76,0) < auVar54._0_4_;
                                      iVar44 = SUB164(auVar79 ^ auVar76,4);
                                      iVar74 = auVar54._4_4_;
                                      if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) &
                                                1)) {
                                        *(undefined8 *)(lVar28 + lVar40) = 0x3ff0000000000000;
                                      }
                                      if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                        *(undefined8 *)(lVar46 + lVar40) = 0x3ff0000000000000;
                                      }
                                      uVar43 = uVar43 + 2;
                                      lVar40 = lVar40 + local_638.jstride * 0x10;
                                    } while (local_2e8 != uVar43);
                                  }
                                  dVar42 = (double)((long)dVar42 + 1);
                                  lVar28 = lVar28 + lVar14;
                                  lVar46 = lVar46 + lVar14;
                                } while (iVar11 != SUB84(dVar42,0));
                              }
                            }
                            else if (((int)local_500 == 0x67) && ((int)uVar7 <= iVar12)) {
                              puVar33 = (undefined8 *)
                                        ((long)local_638.p +
                                        local_638.nstride * local_698 +
                                        ((long)dVar16 - (long)local_638.begin.z) *
                                        local_638.kstride * 8 +
                                        (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                        (long)local_638.begin.x * -8 + local_398);
                              piVar41 = (int *)((long)local_4e0.p +
                                               ((long)dVar16 - (long)local_4e0.begin.z) *
                                               local_4e0.kstride * 4 +
                                               (lVar15 - local_4e0.begin.y) *
                                               CONCAT44(local_4e0.jstride._4_4_,
                                                        (uint)local_4e0.jstride) * 4 +
                                               (long)local_4e0.begin.x * -4 + local_510);
                              dVar42 = dVar16;
                              do {
                                piVar36 = piVar41;
                                puVar50 = puVar33;
                                iVar44 = local_41c;
                                if ((int)uVar5 <= iVar38) {
                                  do {
                                    uVar53 = 0x3ff0000000000000;
                                    if (*piVar36 < 1) {
                                      uVar53 = 0;
                                    }
                                    *puVar50 = uVar53;
                                    puVar50 = puVar50 + local_638.jstride;
                                    piVar36 = piVar36 + CONCAT44(local_4e0.jstride._4_4_,
                                                                 (uint)local_4e0.jstride);
                                    iVar44 = iVar44 + -1;
                                  } while (iVar44 != 0);
                                }
                                dVar42 = (double)((long)dVar42 + 1);
                                puVar33 = puVar33 + local_638.kstride;
                                piVar41 = piVar41 + local_4e0.kstride;
                              } while (iVar11 != SUB84(dVar42,0));
                            }
                          }
                        }
                        else {
                          if (iVar44 == 0x65) {
                            local_3d8[0] = (double)((ulong)dVar42 ^ (ulong)DAT_0074fb00) * local_350
                            ;
                            local_3d8[1] = 0.5;
                            local_3d8[2] = 1.5;
                            local_3d8[3] = 2.5;
                            local_448 = ZEXT816(0);
                            local_458 = local_448;
                            local_468 = local_448;
                            local_478 = local_448;
                            _local_488 = local_448;
                            local_498 = local_448;
                            if (1 < (int)local_4a0) {
                              lVar14 = 2;
                              uVar30 = 0;
                              do {
                                lVar28 = 0;
                                do {
                                  lVar46 = 0;
                                  dVar42 = 1.0;
                                  dVar68 = 1.0;
                                  do {
                                    if (lVar28 != lVar46) {
                                      dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                      dVar68 = dVar68 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                    }
                                    lVar46 = lVar46 + 1;
                                  } while (lVar14 != lVar46);
                                  *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                       dVar42 / dVar68;
                                  lVar28 = lVar28 + 1;
                                } while (lVar28 != lVar14);
                                uVar30 = uVar30 + 1;
                                lVar14 = lVar14 + 1;
                              } while (uVar30 != uVar43);
                            }
                            if ((int)uVar4 <= iVar25) {
                              local_598 = (int *)(long)local_550.begin.y;
                              local_4f8._0_8_ =
                                   local_550.p +
                                   ((long)piVar22 - (long)local_550.begin.z) * local_550.kstride;
                              local_568 = (double *)
                                          CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride);
                              local_570 = (double *)(long)local_5f8.begin.y;
                              local_578 = (double *)local_5f8.jstride;
                              local_438 = local_5f8.p +
                                          ((long)iVar8 - (long)local_5f8.begin.z) *
                                          local_5f8.kstride + local_5f8.nstride * local_430;
                              lVar14 = lVar21;
                              do {
                                if ((int)uVar2 <= iVar37) {
                                  lVar28 = lVar20;
                                  do {
                                    dVar42 = 0.0;
                                    if ((0 < (local_550.p +
                                             ((long)piVar22 - (long)local_550.begin.z) *
                                             local_550.kstride)
                                             [(lVar14 - (long)local_598) * (long)local_568 +
                                              (lVar28 - local_550.begin.x)]) && (1 < (int)uVar24)) {
                                      uVar43 = 0;
                                      bVar31 = false;
                                      do {
                                        if (local_418.p
                                            [(lVar14 - local_418.begin.y) * local_418.jstride +
                                             (lVar28 - local_418.begin.x) +
                                             ((iVar8 - local_418.begin.z) + (int)uVar43) *
                                             local_418.kstride] <= 0.0) {
                                          uVar23 = (int)uVar43 + 1;
                                          break;
                                        }
                                        bVar31 = (bool)(bVar31 | local_418.p
                                                                 [(lVar14 - local_418.begin.y) *
                                                                  local_418.jstride +
                                                                  (lVar28 - local_418.begin.x) +
                                                                  ((iVar8 - local_418.begin.z) +
                                                                  (int)uVar43) * local_418.kstride]
                                                                 < 1.0);
                                        uVar43 = uVar43 + 1;
                                        uVar23 = uVar24;
                                      } while (uVar49 != uVar43);
                                      if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                         (uVar32 = uVar23, uVar23 != 1)) {
                                        dVar42 = *(double *)
                                                  (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                      }
                                    }
                                    (local_5f8.p +
                                    ((long)iVar8 - (long)local_5f8.begin.z) * local_5f8.kstride +
                                    local_5f8.nstride * local_430)
                                    [(lVar14 - (long)local_570) * local_5f8.jstride +
                                     (lVar28 - local_5f8.begin.x)] = dVar42;
                                    lVar28 = lVar28 + 1;
                                  } while (local_37c != (int)lVar28);
                                }
                                lVar14 = lVar14 + 1;
                              } while (iVar47 != (int)lVar14);
                            }
                          }
                          else if (iVar44 == 0x66) {
                            if ((int)uVar4 <= iVar25) {
                              lVar28 = (long)local_5f8.p +
                                       local_5f8.nstride * local_698 +
                                       (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                       (iVar8 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                       (long)local_5f8.begin.x * -8 + local_558 + 8;
                              lVar14 = lVar21;
                              do {
                                if ((int)uVar2 <= iVar37) {
                                  uVar43 = 0;
                                  do {
                                    auVar64._8_4_ = (int)uVar43;
                                    auVar64._0_8_ = uVar43;
                                    auVar64._12_4_ = (int)(uVar43 >> 0x20);
                                    auVar56 = (auVar64 | auVar75) ^ auVar76;
                                    bVar31 = SUB164(local_298 ^ auVar76,0) < auVar56._0_4_;
                                    iVar44 = SUB164(local_298 ^ auVar76,4);
                                    iVar74 = auVar56._4_4_;
                                    if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) & 1)
                                       ) {
                                      *(undefined8 *)(lVar28 + -8 + uVar43 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                      *(undefined8 *)(lVar28 + uVar43 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar43 = uVar43 + 2;
                                  } while (local_358 != uVar43);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_5f8.jstride * 8;
                              } while (iVar47 != (int)lVar14);
                            }
                          }
                          else if ((iVar44 == 0x67) && ((int)uVar4 <= iVar25)) {
                            lVar28 = (long)local_5f8.p +
                                     local_5f8.nstride * local_698 +
                                     (lVar21 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                     (iVar8 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                     (long)local_5f8.begin.x * -8 + local_558;
                            lVar46 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4;
                            lVar40 = (long)local_550.p +
                                     (lVar21 - local_550.begin.y) * lVar46 +
                                     (uVar6 - local_550.begin.z) * local_550.kstride * 4 +
                                     (long)local_550.begin.x * -4 + local_508;
                            lVar14 = lVar21;
                            do {
                              if ((int)uVar2 <= iVar37) {
                                lVar39 = 0;
                                do {
                                  uVar53 = 0x3ff0000000000000;
                                  if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                    uVar53 = 0;
                                  }
                                  *(undefined8 *)(lVar28 + lVar39 * 8) = uVar53;
                                  lVar39 = lVar39 + 1;
                                } while ((int)local_3b8 != (int)lVar39);
                              }
                              lVar14 = lVar14 + 1;
                              lVar28 = lVar28 + local_5f8.jstride * 8;
                              lVar40 = lVar40 + lVar46;
                            } while (iVar47 != (int)lVar14);
                          }
                          uVar43 = local_388;
                          if ((int)local_500 == 0x65) {
                            local_3d8[0] = -dVar69 * local_350;
                            local_3d8[1] = 0.5;
                            local_3d8[2] = 1.5;
                            local_3d8[3] = 2.5;
                            local_448 = ZEXT816(0);
                            local_458 = ZEXT816(0);
                            local_468 = ZEXT816(0);
                            local_478 = ZEXT816(0);
                            _local_488 = ZEXT816(0);
                            local_498 = ZEXT816(0);
                            if (1 < (int)local_4a0) {
                              lVar14 = 2;
                              uVar30 = 0;
                              do {
                                lVar28 = 0;
                                do {
                                  lVar46 = 0;
                                  dVar42 = 1.0;
                                  dVar69 = 1.0;
                                  do {
                                    if (lVar28 != lVar46) {
                                      dVar42 = dVar42 * (-0.5 - local_3d8[lVar46]);
                                      dVar69 = dVar69 * (local_3d8[lVar28] - local_3d8[lVar46]);
                                    }
                                    lVar46 = lVar46 + 1;
                                  } while (lVar14 != lVar46);
                                  *(double *)(local_498 + lVar28 * 8 + uVar30 * 0x20) =
                                       dVar42 / dVar69;
                                  lVar28 = lVar28 + 1;
                                } while (lVar28 != lVar14);
                                uVar30 = uVar30 + 1;
                                lVar14 = lVar14 + 1;
                              } while (uVar30 != uVar43);
                            }
                            auVar56 = local_378;
                            if ((int)uVar5 <= iVar38) {
                              local_3a8 = (double)(long)local_4e0.begin.y;
                              local_598 = local_4e0.p +
                                          ((long)dVar16 - (long)local_4e0.begin.z) *
                                          local_4e0.kstride;
                              local_500 = (double *)
                                          CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride);
                              local_568 = (double *)(long)local_638.begin.y;
                              local_570 = (double *)local_638.jstride;
                              local_578 = local_638.p +
                                          ((long)local_580 - (long)local_638.begin.z) *
                                          local_638.kstride + local_638.nstride * local_430;
                              local_4f8._0_8_ = lVar15;
                              do {
                                if ((int)uVar3 <= iVar13) {
                                  lVar14 = lVar19;
                                  do {
                                    dVar42 = 0.0;
                                    if ((0 < local_598[(local_4f8._0_8_ - (long)local_4e0.begin.y) *
                                                       (long)CONCAT44(local_4e0.jstride._4_4_,
                                                                      (uint)local_4e0.jstride) +
                                                       (lVar14 - local_4e0.begin.x)]) &&
                                       (1 < (int)uVar24)) {
                                      uVar43 = 0;
                                      bVar31 = false;
                                      iVar44 = uVar7 - local_418.begin.z;
                                      do {
                                        if (local_418.p
                                            [(local_4f8._0_8_ - (long)local_418.begin.y) *
                                             local_418.jstride +
                                             (lVar14 - local_418.begin.x) +
                                             iVar44 * local_418.kstride] <= 0.0) {
                                          uVar23 = (int)uVar43 + 1;
                                          break;
                                        }
                                        bVar31 = (bool)(bVar31 | local_418.p
                                                                 [(local_4f8._0_8_ -
                                                                  (long)local_418.begin.y) *
                                                                  local_418.jstride +
                                                                  (lVar14 - local_418.begin.x) +
                                                                  iVar44 * local_418.kstride] < 1.0)
                                        ;
                                        uVar43 = uVar43 + 1;
                                        iVar44 = iVar44 + -1;
                                        uVar23 = uVar24;
                                      } while (uVar49 != uVar43);
                                      if (((bVar31) && (uVar32 = 2, 1 < uVar23)) ||
                                         (uVar32 = uVar23, uVar23 != 1)) {
                                        dVar42 = *(double *)
                                                  (local_498 + (long)(int)(uVar32 * 4 + -7) * 8);
                                      }
                                    }
                                    local_578[(local_4f8._0_8_ - (long)local_568) *
                                              local_638.jstride + (lVar14 - local_638.begin.x)] =
                                         dVar42;
                                    lVar14 = lVar14 + 1;
                                  } while (local_380 != (int)lVar14);
                                }
                                lVar14 = local_4f8._0_8_ + 1;
                                local_4f8._0_8_ = lVar14;
                              } while (iVar48 != (int)lVar14);
                            }
                          }
                          else {
                            auVar56 = local_378;
                            if ((int)local_500 == 0x66) {
                              if ((int)uVar5 <= iVar38) {
                                lVar28 = (long)local_638.p +
                                         local_638.nstride * local_698 +
                                         (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                         (local_580 - local_638.begin.z) * local_638.kstride * 8 +
                                         (long)local_638.begin.x * -8 + local_560 + 8;
                                lVar14 = lVar15;
                                do {
                                  if ((int)uVar3 <= iVar13) {
                                    uVar43 = 0;
                                    do {
                                      auVar66._8_4_ = (int)uVar43;
                                      auVar66._0_8_ = uVar43;
                                      auVar66._12_4_ = (int)(uVar43 >> 0x20);
                                      auVar54 = (auVar66 | auVar75) ^ auVar76;
                                      bVar31 = SUB164(local_378 ^ auVar76,0) < auVar54._0_4_;
                                      iVar44 = SUB164(local_378 ^ auVar76,4);
                                      iVar74 = auVar54._4_4_;
                                      if ((bool)(~(iVar44 < iVar74 || iVar74 == iVar44 && bVar31) &
                                                1)) {
                                        *(undefined8 *)(lVar28 + -8 + uVar43 * 8) =
                                             0x3ff0000000000000;
                                      }
                                      if (iVar44 >= iVar74 && (iVar74 != iVar44 || !bVar31)) {
                                        *(undefined8 *)(lVar28 + uVar43 * 8) = 0x3ff0000000000000;
                                      }
                                      uVar43 = uVar43 + 2;
                                    } while (local_338 != uVar43);
                                  }
                                  lVar14 = lVar14 + 1;
                                  lVar28 = lVar28 + local_638.jstride * 8;
                                } while (iVar48 != (int)lVar14);
                              }
                            }
                            else if (((int)local_500 == 0x67) && ((int)uVar5 <= iVar38)) {
                              lVar28 = (long)local_638.p +
                                       local_638.nstride * local_698 +
                                       (lVar15 - local_638.begin.y) * local_638.jstride * 8 +
                                       (local_580 - local_638.begin.z) * local_638.kstride * 8 +
                                       (long)local_638.begin.x * -8 + local_560;
                              lVar46 = CONCAT44(local_4e0.jstride._4_4_,(uint)local_4e0.jstride) * 4
                              ;
                              lVar40 = (long)local_4e0.p +
                                       (lVar15 - local_4e0.begin.y) * lVar46 +
                                       (uVar7 - local_4e0.begin.z) * local_4e0.kstride * 4 +
                                       (long)local_4e0.begin.x * -4 + local_510;
                              lVar14 = lVar15;
                              do {
                                if ((int)uVar3 <= iVar13) {
                                  lVar39 = 0;
                                  do {
                                    uVar53 = 0x3ff0000000000000;
                                    if (*(int *)(lVar40 + lVar39 * 4) < 1) {
                                      uVar53 = 0;
                                    }
                                    *(undefined8 *)(lVar28 + lVar39 * 8) = uVar53;
                                    lVar39 = lVar39 + 1;
                                  } while ((int)local_3b0 != (int)lVar39);
                                }
                                lVar14 = lVar14 + 1;
                                lVar28 = lVar28 + local_638.jstride * 8;
                                lVar40 = lVar40 + lVar46;
                              } while (iVar48 != (int)lVar14);
                            }
                          }
                        }
                      }
                    }
                    uVar17 = local_430 + 1;
                    local_698 = local_698 + 8;
                    uVar30 = local_328;
                    uVar43 = local_250;
                  } while (uVar17 != local_230);
                }
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != 3);
            MFIter::operator++(&local_210);
          }
          MFIter::~MFIter(&local_210);
          MultiFab::~MultiFab(&local_1b0);
          lVar14 = local_310 + 1;
          piVar18 = (local_280->super_MLLinOp).m_num_mg_levels.
                    super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          this = local_280;
        } while (lVar14 < piVar18[local_278]);
      }
      local_278 = local_278 + 1;
    } while (local_278 < (this->super_MLLinOp).m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLCellLinOp::prepareForSolve ()
{
    BL_PROFILE("MLCellLinOp::prepareForSolve()");

    const int imaxorder = maxorder;
    const int ncomp = getNComp();
    const int hidden_direction = hiddenDirection();
    for (int amrlev = 0;  amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const auto& bcondloc = *m_bcondloc[amrlev][mglev];
            const auto& maskvals = m_maskvals[amrlev][mglev];

            const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
            const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
            const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

            BndryRegister& undrrelxr = m_undrrelxr[amrlev][mglev];
            MultiFab foo(m_grids[amrlev][mglev], m_dmap[amrlev][mglev], ncomp, 0, MFInfo().SetAlloc(false));

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
            const FabArray<EBCellFlagFab>* flags =
                (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            auto area = (factory) ? factory->getAreaFrac()
                : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
#endif

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
#ifdef AMREX_USE_EB
                if (factory) {
                    Vector<PSEBTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction && fabtyp != FabType::covered) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                auto const& ap = (fabtyp == FabType::singlevalued)
                                    ? area[idim]->const_array(mfi) : Array4<Real const>{};
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSEBTag{undrrelxr[olo].array(mfi),
                                                              undrrelxr[ohi].array(mfi),
                                                              ap,
                                                              maskvals[olo].const_array(mfi),
                                                              maskvals[ohi].const_array(mfi),
                                                              bdlv[icomp][olo], bdlv[icomp][ohi],
                                                              amrex::adjCell(vbx,olo),
                                                              bdcv[icomp][olo], bdcv[icomp][ohi],
                                                              vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSEBTag const& tag) noexcept
                    {
                        if (tag.ap) {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x_eb
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x_eb
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y_eb
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y_eb
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z_eb
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z_eb
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        } else {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        }
                    });
                } else
#endif
                {
                    Vector<PSTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSTag{undrrelxr[olo].array(mfi),
                                                            undrrelxr[ohi].array(mfi),
                                                            maskvals[olo].const_array(mfi),
                                                            maskvals[ohi].const_array(mfi),
                                                            bdlv[icomp][olo], bdlv[icomp][ohi],
                                                            amrex::adjCell(vbx,olo),
                                                            bdcv[icomp][olo], bdcv[icomp][ohi],
                                                            vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSTag const& tag) noexcept
                    {
                        if (tag.dir == 0)
                        {
                            mllinop_comp_interp_coef0_x
                                (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                            mllinop_comp_interp_coef0_x
                                (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 1)
                        else
#if (AMREX_SPACEDIM > 2)
                        if (tag.dir == 1)
#endif
                        {
                            mllinop_comp_interp_coef0_y
                                (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                            mllinop_comp_interp_coef0_y
                                (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 2)
                        else {
                            mllinop_comp_interp_coef0_z
                                (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                            mllinop_comp_interp_coef0_z
                                (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                        }
#endif
#endif
                    });
                }
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(foo, MFItInfo{}.SetDynamic(true)); mfi.isValid(); ++mfi)
                {
                    const Box& vbx = mfi.validbox();

                    const auto & bdlv = bcondloc.bndryLocs(mfi);
                    const auto & bdcv = bcondloc.bndryConds(mfi);

#ifdef AMREX_USE_EB
                    auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
#endif
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (idim == hidden_direction) continue;
                        const Orientation olo(idim,Orientation::low);
                        const Orientation ohi(idim,Orientation::high);
                        const Box blo = amrex::adjCellLo(vbx, idim);
                        const Box bhi = amrex::adjCellHi(vbx, idim);
                        const int blen = vbx.length(idim);
                        const auto& mlo = maskvals[olo].array(mfi);
                        const auto& mhi = maskvals[ohi].array(mfi);
                        const auto& flo = undrrelxr[olo].array(mfi);
                        const auto& fhi = undrrelxr[ohi].array(mfi);
                        for (int icomp = 0; icomp < ncomp; ++icomp) {
                            const BoundCond bctlo = bdcv[icomp][olo];
                            const BoundCond bcthi = bdcv[icomp][ohi];
                            const Real bcllo = bdlv[icomp][olo];
                            const Real bclhi = bdlv[icomp][ohi];
#ifdef AMREX_USE_EB
                            if (fabtyp == FabType::singlevalued) {
                                Array4<Real const> const& ap = area[idim]->const_array(mfi);
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            } else if (fabtyp == FabType::regular)
#endif
                            {
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}